

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTest.cpp
# Opt level: O0

void type_test(void)

{
  ostream *this;
  LogStream *__s;
  longdouble lVar1;
  undefined4 in_stack_ffffffffffff30e8;
  undefined4 uVar2;
  undefined2 in_stack_ffffffffffff30ec;
  undefined2 uVar3;
  undefined1 in_stack_ffffffffffff30ee;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffff30ef;
  char v;
  undefined2 in_stack_ffffffffffff30f0;
  undefined2 uVar5;
  undefined6 in_stack_ffffffffffff30f2;
  double in_stack_ffffffffffff30f8;
  string *v_00;
  LogStream *in_stack_ffffffffffff3100;
  Logger *pLVar6;
  undefined2 in_stack_ffffffffffff3108;
  LogStream *in_stack_ffffffffffff3110;
  allocator<char> *__a;
  Logger *in_stack_ffffffffffff3130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string local_ce29;
  Logger local_ce08;
  Logger local_be30;
  allocator<char> local_ae58 [4056];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e80 [126];
  Logger local_8ea8;
  Logger local_7ed0;
  Logger local_6ef8;
  Logger local_5f20;
  Logger local_4f48;
  Logger local_3f70;
  Logger local_2f98;
  Logger local_1fc0;
  Logger local_fd8;
  
  this = std::operator<<((ostream *)&std::cout,"-------------type test---------------");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Logger::Logger((Logger *)CONCAT62(in_stack_ffffffffffff30f2,in_stack_ffffffffffff30f0),
                 (char *)CONCAT17(in_stack_ffffffffffff30ef,
                                  CONCAT16(in_stack_ffffffffffff30ee,
                                           CONCAT24(in_stack_ffffffffffff30ec,
                                                    in_stack_ffffffffffff30e8))),0);
  Logger::stream(&local_fd8);
  LogStream::operator<<
            ((LogStream *)CONCAT62(in_stack_ffffffffffff30f2,in_stack_ffffffffffff30f0),
             CONCAT13(in_stack_ffffffffffff30ef,
                      CONCAT12(in_stack_ffffffffffff30ee,in_stack_ffffffffffff30ec)));
  Logger::~Logger(in_stack_ffffffffffff3130);
  Logger::Logger((Logger *)CONCAT62(in_stack_ffffffffffff30f2,in_stack_ffffffffffff30f0),
                 (char *)CONCAT17(in_stack_ffffffffffff30ef,
                                  CONCAT16(in_stack_ffffffffffff30ee,
                                           CONCAT24(in_stack_ffffffffffff30ec,
                                                    in_stack_ffffffffffff30e8))),0);
  Logger::stream(&local_1fc0);
  LogStream::operator<<
            ((LogStream *)CONCAT62(in_stack_ffffffffffff30f2,in_stack_ffffffffffff30f0),
             CONCAT17(in_stack_ffffffffffff30ef,
                      CONCAT16(in_stack_ffffffffffff30ee,
                               CONCAT24(in_stack_ffffffffffff30ec,in_stack_ffffffffffff30e8))));
  Logger::~Logger(in_stack_ffffffffffff3130);
  Logger::Logger((Logger *)CONCAT62(in_stack_ffffffffffff30f2,in_stack_ffffffffffff30f0),
                 (char *)CONCAT17(in_stack_ffffffffffff30ef,
                                  CONCAT16(in_stack_ffffffffffff30ee,
                                           CONCAT24(in_stack_ffffffffffff30ec,
                                                    in_stack_ffffffffffff30e8))),0);
  Logger::stream(&local_2f98);
  LogStream::operator<<
            ((LogStream *)CONCAT62(in_stack_ffffffffffff30f2,in_stack_ffffffffffff30f0),
             (float)CONCAT13(in_stack_ffffffffffff30ef,
                             CONCAT12(in_stack_ffffffffffff30ee,in_stack_ffffffffffff30ec)));
  Logger::~Logger(in_stack_ffffffffffff3130);
  Logger::Logger((Logger *)CONCAT62(in_stack_ffffffffffff30f2,in_stack_ffffffffffff30f0),
                 (char *)CONCAT17(in_stack_ffffffffffff30ef,
                                  CONCAT16(in_stack_ffffffffffff30ee,
                                           CONCAT24(in_stack_ffffffffffff30ec,
                                                    in_stack_ffffffffffff30e8))),0);
  Logger::stream(&local_3f70);
  LogStream::operator<<(in_stack_ffffffffffff3100,in_stack_ffffffffffff30f8);
  Logger::~Logger(in_stack_ffffffffffff3130);
  Logger::Logger((Logger *)CONCAT62(in_stack_ffffffffffff30f2,in_stack_ffffffffffff30f0),
                 (char *)CONCAT17(in_stack_ffffffffffff30ef,
                                  CONCAT16(in_stack_ffffffffffff30ee,
                                           CONCAT24(in_stack_ffffffffffff30ec,
                                                    in_stack_ffffffffffff30e8))),0);
  Logger::stream(&local_4f48);
  LogStream::operator<<
            ((LogStream *)CONCAT62(in_stack_ffffffffffff30f2,in_stack_ffffffffffff30f0),
             CONCAT11(in_stack_ffffffffffff30ef,in_stack_ffffffffffff30ee));
  Logger::~Logger(in_stack_ffffffffffff3130);
  Logger::Logger((Logger *)CONCAT62(in_stack_ffffffffffff30f2,in_stack_ffffffffffff30f0),
                 (char *)CONCAT17(in_stack_ffffffffffff30ef,
                                  CONCAT16(in_stack_ffffffffffff30ee,
                                           CONCAT24(in_stack_ffffffffffff30ec,
                                                    in_stack_ffffffffffff30e8))),0);
  Logger::stream(&local_5f20);
  LogStream::operator<<
            ((LogStream *)CONCAT62(in_stack_ffffffffffff30f2,in_stack_ffffffffffff30f0),
             CONCAT17(in_stack_ffffffffffff30ef,
                      CONCAT16(in_stack_ffffffffffff30ee,
                               CONCAT24(in_stack_ffffffffffff30ec,in_stack_ffffffffffff30e8))));
  Logger::~Logger(in_stack_ffffffffffff3130);
  Logger::Logger((Logger *)CONCAT62(in_stack_ffffffffffff30f2,in_stack_ffffffffffff30f0),
                 (char *)CONCAT17(in_stack_ffffffffffff30ef,
                                  CONCAT16(in_stack_ffffffffffff30ee,
                                           CONCAT24(in_stack_ffffffffffff30ec,
                                                    in_stack_ffffffffffff30e8))),0);
  Logger::stream(&local_6ef8);
  LogStream::operator<<
            ((LogStream *)CONCAT62(in_stack_ffffffffffff30f2,in_stack_ffffffffffff30f0),
             CONCAT13(in_stack_ffffffffffff30ef,
                      CONCAT12(in_stack_ffffffffffff30ee,in_stack_ffffffffffff30ec)));
  Logger::~Logger(in_stack_ffffffffffff3130);
  Logger::Logger((Logger *)CONCAT62(in_stack_ffffffffffff30f2,in_stack_ffffffffffff30f0),
                 (char *)CONCAT17(in_stack_ffffffffffff30ef,
                                  CONCAT16(in_stack_ffffffffffff30ee,
                                           CONCAT24(in_stack_ffffffffffff30ec,
                                                    in_stack_ffffffffffff30e8))),0);
  Logger::stream(&local_7ed0);
  LogStream::operator<<
            ((LogStream *)CONCAT62(in_stack_ffffffffffff30f2,in_stack_ffffffffffff30f0),
             CONCAT17(in_stack_ffffffffffff30ef,
                      CONCAT16(in_stack_ffffffffffff30ee,
                               CONCAT24(in_stack_ffffffffffff30ec,in_stack_ffffffffffff30e8))));
  Logger::~Logger(in_stack_ffffffffffff3130);
  Logger::Logger((Logger *)CONCAT62(in_stack_ffffffffffff30f2,in_stack_ffffffffffff30f0),
                 (char *)CONCAT17(in_stack_ffffffffffff30ef,
                                  CONCAT16(in_stack_ffffffffffff30ee,
                                           CONCAT24(in_stack_ffffffffffff30ec,
                                                    in_stack_ffffffffffff30e8))),0);
  Logger::stream(&local_8ea8);
  lVar1 = (longdouble)1.6555556;
  uVar2 = SUB104(lVar1,0);
  uVar3 = (undefined2)((unkuint10)lVar1 >> 0x20);
  uVar4 = (undefined1)((unkuint10)lVar1 >> 0x30);
  v = (char)((unkuint10)lVar1 >> 0x38);
  uVar5 = (undefined2)((unkuint10)lVar1 >> 0x40);
  LogStream::operator<<
            (in_stack_ffffffffffff3110,
             (longdouble)CONCAT28(in_stack_ffffffffffff3108,in_stack_ffffffffffff3100));
  Logger::~Logger(in_stack_ffffffffffff3130);
  this_00 = local_9e80;
  Logger::Logger((Logger *)CONCAT62(in_stack_ffffffffffff30f2,uVar5),
                 (char *)CONCAT17(v,CONCAT16(uVar4,CONCAT24(uVar3,uVar2))),0);
  Logger::stream((Logger *)this_00);
  LogStream::operator<<
            ((LogStream *)CONCAT62(in_stack_ffffffffffff30f2,uVar5),
             CONCAT17(v,CONCAT16(uVar4,CONCAT24(uVar3,uVar2))));
  Logger::~Logger((Logger *)this_00);
  __a = local_ae58;
  Logger::Logger((Logger *)CONCAT62(in_stack_ffffffffffff30f2,uVar5),
                 (char *)CONCAT17(v,CONCAT16(uVar4,CONCAT24(uVar3,uVar2))),0);
  __s = Logger::stream((Logger *)__a);
  LogStream::operator<<((LogStream *)CONCAT62(in_stack_ffffffffffff30f2,uVar5),v);
  Logger::~Logger((Logger *)this_00);
  pLVar6 = &local_be30;
  Logger::Logger((Logger *)CONCAT62(in_stack_ffffffffffff30f2,uVar5),
                 (char *)CONCAT17(v,CONCAT16(uVar4,CONCAT24(uVar3,uVar2))),0);
  Logger::stream(pLVar6);
  LogStream::operator<<
            ((LogStream *)CONCAT62(in_stack_ffffffffffff30f2,uVar5),
             (char *)CONCAT17(v,CONCAT16(uVar4,CONCAT24(uVar3,uVar2))));
  Logger::~Logger((Logger *)this_00);
  pLVar6 = &local_ce08;
  Logger::Logger((Logger *)CONCAT62(in_stack_ffffffffffff30f2,uVar5),
                 (char *)CONCAT17(v,CONCAT16(uVar4,CONCAT24(uVar3,uVar2))),0);
  Logger::stream(pLVar6);
  v_00 = &local_ce29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  LogStream::operator<<((LogStream *)pLVar6,v_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT62(in_stack_ffffffffffff30f2,uVar5));
  std::allocator<char>::~allocator((allocator<char> *)&local_ce29);
  Logger::~Logger((Logger *)this_00);
  return;
}

Assistant:

void type_test(){
    cout<<"-------------type test---------------"<<endl;
    LOG<<0;
    LOG<<1234567890123;
    LOG<<1.0f;
    LOG<<3.1415926;
    LOG<<(short) 1;
    LOG<<(long long) 1;
    LOG<<(unsigned int) 1;
    LOG<<(unsigned long) 1;
    LOG<<(long double) 1.6555556;
    LOG<<(unsigned long long) 1;
    LOG<<'c';
    LOG<<"abcdefg";
    LOG<<string("this is a string");
}